

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip38.c
# Opt level: O2

void aes_dec_impl(uchar *cyphertext,uchar *xor,uchar *key,uchar *bytes_out)

{
  long lVar1;
  
  wally_aes(key,0x20,cyphertext,0x10,2,bytes_out,0x10);
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
    bytes_out[lVar1] = bytes_out[lVar1] ^ xor[lVar1];
  }
  return;
}

Assistant:

static void aes_dec_impl(const unsigned char *cyphertext, const unsigned char *xor,
                         const unsigned char *key, unsigned char *bytes_out)
{
    size_t i;

    wally_aes(key, AES_KEY_LEN_256,
              (unsigned char *)cyphertext, AES_BLOCK_LEN,
              AES_FLAG_DECRYPT,
              bytes_out, AES_BLOCK_LEN);

    for (i = 0; i < AES_BLOCK_LEN; ++i)
        bytes_out[i] ^= xor[i];
}